

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O0

void * trico_open_archive_for_reading(uint8_t *data,uint64_t data_size)

{
  int iVar1;
  trico_archive *arch;
  uint64_t data_size_local;
  uint8_t *data_local;
  
  data_local = (uint8_t *)trico_malloc(0x48);
  ((trico_archive *)data_local)->buffer = (uint8_t *)0x0;
  ((trico_archive *)data_local)->buffer_pointer = (uint8_t *)0x0;
  ((trico_archive *)data_local)->data = (uint8_t *)0x0;
  ((trico_archive *)data_local)->data_pointer = (uint8_t *)0x0;
  ((trico_archive *)data_local)->version = 0;
  ((trico_archive *)data_local)->next_stream_type = trico_empty;
  ((trico_archive *)data_local)->buffer_size = 0;
  ((trico_archive *)data_local)->data_size = 0;
  ((trico_archive *)data_local)->size_available = 0;
  ((trico_archive *)data_local)->writable = 0;
  ((trico_archive *)data_local)->data = data;
  ((trico_archive *)data_local)->data_pointer = ((trico_archive *)data_local)->data;
  ((trico_archive *)data_local)->data_size = data_size;
  iVar1 = read_header((trico_archive *)data_local);
  if (iVar1 == 0) {
    trico_free(data_local);
    data_local = (uint8_t *)0x0;
  }
  return data_local;
}

Assistant:

void* trico_open_archive_for_reading(const uint8_t* data, uint64_t data_size)
  {
  struct trico_archive* arch = (struct trico_archive*)trico_malloc(sizeof(struct trico_archive));
  arch->buffer = NULL;
  arch->buffer_pointer = NULL;
  arch->data = NULL;
  arch->data_pointer = NULL;
  arch->version = 0;
  arch->next_stream_type = trico_empty;
  arch->buffer_size = 0;
  arch->data_size = 0;
  arch->size_available = 0;
  arch->writable = 0;

  arch->data = data;
  arch->data_pointer = arch->data;
  arch->data_size = data_size;
  if (!read_header(arch))
    {
    trico_free(arch);
    return NULL;
    }
  return arch;
  }